

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzmatredstructmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZFMatrix<double>,_double,_TPZStructMatrixOR<double>_>
::TPZMatRedStructMatrix
          (TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZFMatrix<double>,_double,_TPZStructMatrixOR<double>_>
           *this)

{
  *(undefined8 *)&this->field_0xb0 = 0x19e7600;
  *(undefined4 *)&this->field_0xb8 = 0;
  this->field_0xbc = 1;
  memset(this,0,0xa0);
  TPZStructMatrix::TPZStructMatrix((TPZStructMatrix *)this,&PTR_construction_vtable_104__019e66c8);
  *(undefined8 *)&this->field_0xb0 = 0x19e70d8;
  *(undefined8 *)this = 0x19e6ff8;
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)&this->field_0xa0,&PTR_construction_vtable_104__019e66f0);
  *(undefined8 *)&this->field_0xb0 = 0x19e6648;
  *(undefined8 *)this = 0x19e6488;
  *(undefined8 *)&this->field_0xa0 = 0x19e6548;
  return;
}

Assistant:

TPZMatRedStructMatrix<TStructMatrix,TSparseMatrix,TVar,TPar>::TPZMatRedStructMatrix() : TPZStructMatrixT<TVar>()
{
}